

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::Generate
          (MessageBuilderLiteGenerator *this,Printer *printer)

{
  OneofDescriptor *oneof;
  Printer *this_00;
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  ImmutableFieldLiteGenerator *pIVar3;
  Descriptor *descriptor;
  AlphaNum *a;
  long lVar4;
  int i;
  long lVar5;
  allocator local_e1;
  Printer *local_e0;
  _Rb_tree_node_base *local_d8;
  AlphaNum local_d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_70;
  key_type local_50;
  
  WriteMessageDocComment(printer,this->descriptor_);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&vars,this->name_resolver_,this->descriptor_);
  ExtraBuilderInterfaces_abi_cxx11_((string *)&local_d0,(java *)this->descriptor_,descriptor);
  local_70._M_dataplus._M_p = "";
  if (0 < *(int *)(this->descriptor_ + 0x78)) {
    local_70._M_dataplus._M_p = "Extendable";
  }
  io::Printer::
  Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[11],char_const*>
            (printer,
             "public static final class Builder extends\n    com.google.protobuf.GeneratedMessageLite.$extendible$Builder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
             ,(char (*) [10])0x3dd2a7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
             (char (*) [17])"extra_interfaces",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
             (char (*) [11])"extendible",(char **)&local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&vars);
  io::Printer::Indent(printer);
  local_e0 = printer;
  GenerateCommonBuilderMethods(this,printer);
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8 = &(this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var2 = (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      this_00 = local_e0, p_Var2 != local_d8; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    oneof = *(OneofDescriptor **)(p_Var2 + 1);
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    std::__cxx11::string::string((string *)&local_d0,"oneof_name",(allocator *)&local_70);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_d0);
    std::__cxx11::string::_M_assign((string *)pmVar1);
    std::__cxx11::string::~string((string *)&local_d0);
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    std::__cxx11::string::string
              ((string *)&local_d0,"oneof_capitalized_name",(allocator *)&local_70);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_d0);
    std::__cxx11::string::_M_assign((string *)pmVar1);
    std::__cxx11::string::~string((string *)&local_d0);
    strings::AlphaNum::AlphaNum
              (&local_d0,(int)(((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) / 0x28));
    StrCat_abi_cxx11_(&local_70,(protobuf *)&local_d0,a);
    std::__cxx11::string::string((string *)&local_50,"oneof_index",&local_e1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_50);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    io::Printer::Print(local_e0,&vars,
                       "@java.lang.Override\npublic $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return instance.get$oneof_capitalized_name$Case();\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  copyOnWrite();\n  instance.clear$oneof_capitalized_name$();\n  return this;\n}\n\n"
                      );
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this->descriptor_ + 4); lVar5 = lVar5 + 1) {
    io::Printer::Print<>(this_00,"\n");
    pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar4));
    (*pIVar3->_vptr_ImmutableFieldLiteGenerator[5])(pIVar3,this_00);
    lVar4 = lVar4 + 0x48;
  }
  io::Printer::Print<char[10],std::__cxx11::string>
            (this_00,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
             (char (*) [10])0x3e7d3e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(this->descriptor_ + 8) + 0x20));
  io::Printer::Outdent(this_00);
  io::Printer::Print<>(this_00,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageBuilderLiteGenerator::Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  printer->Print(
      "public static final class Builder extends\n"
      "    com.google.protobuf.GeneratedMessageLite.$extendible$Builder<\n"
      "      $classname$, Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "extendible",
      descriptor_->extension_range_count() > 0 ? "Extendable" : "");
  printer->Indent();

  GenerateCommonBuilderMethods(printer);

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());

    // oneofCase() and clearOneof()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "    get$oneof_capitalized_name$Case() {\n"
                   "  return instance.get$oneof_capitalized_name$Case();\n"
                   "}\n"
                   "\n"
                   "public Builder clear$oneof_capitalized_name$() {\n"
                   "  copyOnWrite();\n"
                   "  instance.clear$oneof_capitalized_name$();\n"
                   "  return this;\n"
                   "}\n"
                   "\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderMembers(printer);
  }

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}